

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  long lVar2;
  FilePath *in_RDI;
  FilePath *in_stack_00000018;
  FilePath *in_stack_00000030;
  FilePath parent;
  bool local_72;
  FilePath *in_stack_ffffffffffffffa0;
  FilePath *in_stack_ffffffffffffffd8;
  FilePath *in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar1 = IsDirectory(in_stack_ffffffffffffffa0);
  if (bVar1) {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || (bVar1 = DirectoryExists(in_stack_00000030), bVar1)) {
      local_1 = true;
    }
    else {
      RemoveTrailingPathSeparator(in_stack_ffffffffffffffd8);
      RemoveFileName(in_stack_00000018);
      ~FilePath((FilePath *)0x13922f);
      bVar1 = CreateDirectoriesRecursively(in_stack_ffffffffffffffe8);
      local_72 = false;
      if (bVar1) {
        local_72 = CreateFolder(in_RDI);
      }
      local_1 = local_72;
      ~FilePath((FilePath *)0x13927e);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}